

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int atomsClose(atom *a,atom *b,float probeRad)

{
  float fVar1;
  double dVar2;
  float dsq;
  float lim;
  int nearpt;
  float probeRad_local;
  atom *b_local;
  atom *a_local;
  
  dsq = 0.0;
  fVar1 = a->radius + b->radius + probeRad + probeRad;
  dVar2 = v3distanceSq(&a->loc,&b->loc);
  if ((1e-05 < (float)dVar2) && ((float)dVar2 <= fVar1 * fVar1)) {
    dsq = 1.4013e-45;
  }
  return (int)dsq;
}

Assistant:

int atomsClose(atom *a, atom *b, float probeRad)
{
   int nearpt = FALSE;
   float lim = 0.0, dsq = 0.0;

   lim = a->radius + b->radius + probeRad + probeRad;

   dsq = (float)v3distanceSq(&(a->loc), &(b->loc));

   /* if too close they must be the same atom...dummy atom?? */

/*removing the (dsq > 0.001) test actually removes one side of a clash!!*/
/*20111207 dcr changed test to .003*.003 = .00001 i.e. .001 in each coord */
/* to minimize false same-atom-ness but still allow filtering of dummy atoms*/
   if ((dsq > 0.00001) && (dsq <= (lim*lim)))
   {
      nearpt = TRUE;
   }
   return nearpt;
}